

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_u8x3.c
# Opt level: O3

void convolve(uint8_t *x,uint8_t *y,int sz,uint8_t *k,int ksz)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  
  if ((ksz & 1U) != 0) {
    uVar1 = ksz / 2;
    uVar3 = sz;
    if ((int)uVar1 < sz) {
      uVar3 = uVar1;
    }
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        y[uVar4] = x[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    uVar3 = sz - ksz;
    if (uVar3 != 0 && ksz <= sz) {
      uVar4 = 0;
      puVar7 = x;
      do {
        uVar5 = 0;
        if (0 < ksz) {
          uVar6 = 0;
          do {
            uVar5 = uVar5 + (uint)puVar7[uVar6] * (uint)k[uVar6];
            uVar6 = uVar6 + 1;
          } while ((uint)ksz != uVar6);
          uVar5 = uVar5 >> 8;
        }
        y[uVar4 + (long)(int)uVar1] = (uint8_t)uVar5;
        uVar4 = uVar4 + 1;
        puVar7 = puVar7 + 1;
      } while (uVar4 != uVar3);
    }
    if ((int)(uVar3 + uVar1) < sz) {
      lVar2 = (long)(int)(uVar3 + uVar1);
      do {
        y[lVar2] = x[lVar2];
        lVar2 = lVar2 + 1;
      } while (sz != lVar2);
    }
    return;
  }
  __assert_fail("(ksz&1)==1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/image_u8x3.c"
                ,0xbb,"void convolve(const uint8_t *, uint8_t *, int, const uint8_t *, int)");
}

Assistant:

static void convolve(const uint8_t *x, uint8_t *y, int sz, const uint8_t *k, int ksz)
{
    assert((ksz&1)==1);

    for (int i = 0; i < ksz/2 && i < sz; i++)
        y[i] = x[i];

    for (int i = 0; i < sz - ksz; i++) {
        uint32_t acc = 0;

        for (int j = 0; j < ksz; j++)
            acc += k[j]*x[i+j];

        y[ksz/2 + i] = acc >> 8;
    }

    for (int i = sz - ksz + ksz/2; i < sz; i++)
        y[i] = x[i];
}